

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3MsrBufferData(Fts3MultiSegReader *pMsr,char *pList,i64 nList)

{
  void *pvVar1;
  size_t in_RDX;
  void *in_RSI;
  long in_RDI;
  int nNew;
  char *pNew;
  void *in_stack_ffffffffffffffc8;
  
  if (*(long *)(in_RDI + 0x20) < (long)(in_RDX + 0x14)) {
    pvVar1 = sqlite3_realloc64(in_stack_ffffffffffffffc8,0x2431f9);
    if (pvVar1 == (void *)0x0) {
      return 7;
    }
    *(void **)(in_RDI + 0x18) = pvVar1;
    *(long *)(in_RDI + 0x20) = (long)((int)in_RDX * 2 + 0x14);
  }
  memcpy(*(void **)(in_RDI + 0x18),in_RSI,in_RDX);
  memset((void *)(*(long *)(in_RDI + 0x18) + in_RDX),0,0x14);
  return 0;
}

Assistant:

static int fts3MsrBufferData(
  Fts3MultiSegReader *pMsr,       /* Multi-segment-reader handle */
  char *pList,
  i64 nList
){
  if( (nList+FTS3_NODE_PADDING)>pMsr->nBuffer ){
    char *pNew;
    int nNew = nList*2 + FTS3_NODE_PADDING;
    pNew = (char *)sqlite3_realloc64(pMsr->aBuffer, nNew);
    if( !pNew ) return SQLITE_NOMEM;
    pMsr->aBuffer = pNew;
    pMsr->nBuffer = nNew;
  }

  assert( nList>0 );
  memcpy(pMsr->aBuffer, pList, nList);
  memset(&pMsr->aBuffer[nList], 0, FTS3_NODE_PADDING);
  return SQLITE_OK;
}